

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

SymbolEntryMap * __thiscall
bhf::ads::SymbolAccess::FetchSymbolEntries_abi_cxx11_
          (SymbolEntryMap *__return_storage_ptr__,SymbolAccess *this)

{
  ostream *poVar1;
  void *pvVar2;
  AdsException *pAVar3;
  ulong uVar4;
  uchar *buffer;
  pointer ppVar5;
  uint uVar6;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_SymbolEntry>_>::value,_pair<iterator,_bool>_>
  _Var7;
  string local_6b0 [32];
  stringstream local_690 [8];
  stringstream stream_2;
  ostream local_680 [380];
  uint local_504;
  _Base_ptr local_500;
  undefined1 local_4f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
  local_4f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>
  local_450;
  undefined1 local_448;
  undefined1 local_440 [8];
  SymbolEntry next;
  SymbolEntry *pSStack_3b8;
  uint nSymbols;
  uint8_t *data;
  stringstream local_390 [8];
  stringstream stream_1;
  ostream local_380 [383];
  allocator<unsigned_char> local_201;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> symbols;
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8 [376];
  long local_30;
  long status;
  uint local_20;
  AdsSymbolUploadInfo uploadInfo;
  uint32_t bytesRead;
  SymbolAccess *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  *entries;
  
  uploadInfo.nSymbols = 0;
  unique0x1000068f = this;
  local_30 = AdsDevice::ReadReqEx2
                       (&this->device,0xf00c,0,8,(void *)((long)&status + 4),&uploadInfo.nSymbols);
  if (local_30 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,"FetchSymbolEntries");
    poVar1 = std::operator<<(poVar1,"(): Reading symbol info failed with: 0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,local_30);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,(string *)
                  &symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,local_30);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  local_20 = letoh<unsigned_int>(&local_20);
  uVar4 = (ulong)local_20;
  std::allocator<unsigned_char>::allocator(&local_201);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,uVar4,&local_201);
  std::allocator<unsigned_char>::~allocator(&local_201);
  uVar4 = (ulong)local_20;
  buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
  local_30 = AdsDevice::ReadReqEx2(&this->device,0xf00b,0,uVar4,buffer,&uploadInfo.nSymbols);
  if (local_30 == 0) {
    pSStack_3b8 = (SymbolEntry *)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
    next._124_4_ = letoh<unsigned_int>((uint *)((long)&status + 4));
    next._123_1_ = 0;
    memset(__return_storage_ptr__,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
    ::map(__return_storage_ptr__);
    do {
      uVar6 = next._124_4_ - 1;
      if (next._124_4_ == 0) {
        next._124_4_ = uVar6;
        std::__cxx11::stringstream::stringstream(local_690);
        poVar1 = std::operator<<(local_680,"FetchSymbolEntries");
        poVar1 = std::operator<<(poVar1,"(): nSymbols: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,status._4_4_);
        poVar1 = std::operator<<(poVar1," nSymSize:");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
        std::operator<<(poVar1,"\'\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_6b0);
        std::__cxx11::string::~string((string *)local_6b0);
        std::__cxx11::stringstream::~stringstream(local_690);
        pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
        AdsException::AdsException(pAVar3,0x706);
        __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
      }
      next._124_4_ = uVar6;
      SymbolEntry::Parse_abi_cxx11_
                (&local_4f0,pSStack_3b8,(uint8_t *)(ulong)uploadInfo.nSymbols,(ulong)uVar6);
      _Var7 = std::
              map<std::__cxx11::string,bhf::ads::SymbolEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
              ::insert<std::pair<std::__cxx11::string,bhf::ads::SymbolEntry>>
                        ((map<std::__cxx11::string,bhf::ads::SymbolEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
                          *)__return_storage_ptr__,&local_4f0);
      local_500 = (_Base_ptr)_Var7.first._M_node;
      local_4f8 = _Var7.second;
      local_450._M_node = local_500;
      local_448 = local_4f8;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>
               ::operator->(&local_450);
      SymbolEntry::SymbolEntry((SymbolEntry *)local_440,&ppVar5->second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
      ::~pair(&local_4f0);
      uploadInfo.nSymbols = uploadInfo.nSymbols - local_440._0_4_;
      pSStack_3b8 = (SymbolEntry *)
                    ((long)&(pSStack_3b8->header).entryLength + (ulong)(uint)local_440._0_4_);
      if (uploadInfo.nSymbols == 0) {
        next._123_1_ = 1;
      }
      local_504 = (uint)(uploadInfo.nSymbols == 0);
      SymbolEntry::~SymbolEntry((SymbolEntry *)local_440);
    } while (local_504 == 0);
    if ((next._123_1_ & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
      ::~map(__return_storage_ptr__);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_390);
  poVar1 = std::operator<<(local_380,"FetchSymbolEntries");
  poVar1 = std::operator<<(poVar1,"(): Reading symbols failed with: 0x");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,local_30);
  std::operator<<(poVar1,'\n');
  std::__cxx11::stringstream::str();
  Logger::Log(3,(string *)&data);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::stringstream::~stringstream(local_390);
  pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(pAVar3,local_30);
  __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

SymbolEntryMap SymbolAccess::FetchSymbolEntries() const
{
    uint32_t bytesRead = 0;
    struct AdsSymbolUploadInfo {
        uint32_t nSymbols;
        uint32_t nSymSize;
    } uploadInfo;
    auto status = device.ReadReqEx2(ADSIGRP_SYM_UPLOADINFO,
                                    0,
                                    sizeof(uploadInfo),
                                    &uploadInfo,
                                    &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbol info failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    uploadInfo.nSymSize = bhf::ads::letoh(uploadInfo.nSymSize);
    std::vector<uint8_t> symbols(uploadInfo.nSymSize);
    status = device.ReadReqEx2(ADSIGRP_SYM_UPLOAD,
                               0,
                               uploadInfo.nSymSize,
                               symbols.data(),
                               &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbols failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    const uint8_t* data = symbols.data();
    auto nSymbols = bhf::ads::letoh(uploadInfo.nSymbols);
    auto entries = std::map<std::string, SymbolEntry> {};
    while (nSymbols--) {
        const auto next = entries.insert(bhf::ads::SymbolEntry::Parse(data, bytesRead)).first->second;
        bytesRead -= next.header.entryLength;
        data += next.header.entryLength;
        if (!bytesRead) {
            return entries;
        }
    }
    LOG_ERROR(__FUNCTION__ << "(): nSymbols: " << uploadInfo.nSymbols << " nSymSize:" << uploadInfo.nSymSize << "'\n");
    throw AdsException(ADSERR_DEVICE_INVALIDDATA);
}